

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O3

void gflags::anon_unknown_5::Test_FromEnvTest_LegalValues::Run(void)

{
  bool bVar1;
  int32 iVar2;
  uint32 uVar3;
  int iVar4;
  int64 iVar5;
  uint64 uVar6;
  char *pcVar7;
  undefined8 extraout_RAX;
  double dVar8;
  FlagSaver fs;
  FlagSaver local_10;
  
  FlagSaver::FlagSaver(&local_10);
  fprintf(_stderr,"Running test %s/%s\n","FromEnvTest","LegalValues");
  setenv("BOOL_VAL1","true",1);
  setenv("BOOL_VAL2","false",1);
  setenv("BOOL_VAL3","1",1);
  setenv("BOOL_VAL4","F",1);
  bVar1 = BoolFromEnv("BOOL_VAL1",false);
  _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run((Test_FromEnvTest_LegalValues *)(ulong)bVar1);
  bVar1 = BoolFromEnv("BOOL_VAL2",true);
  if (bVar1) {
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f12:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f17:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f1c:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f21:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f26:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f2b:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f30:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f35:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f3a:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f3f:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f44:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f49:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f4e:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f53:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f58:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f5d:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f62:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f67:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f6c:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f71:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f76:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f7b:
    _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
  }
  else {
    bVar1 = BoolFromEnv("BOOL_VAL3",false);
    if (!bVar1) goto LAB_00136f12;
    bVar1 = BoolFromEnv("BOOL_VAL4",true);
    if (bVar1) goto LAB_00136f17;
    bVar1 = BoolFromEnv("BOOL_VAL_UNKNOWN",true);
    if (!bVar1) goto LAB_00136f1c;
    bVar1 = BoolFromEnv("BOOL_VAL_UNKNOWN",false);
    if (bVar1) goto LAB_00136f21;
    setenv("INT_VAL1","1",1);
    setenv("INT_VAL2","-1",1);
    iVar2 = Int32FromEnv("INT_VAL1",10);
    if (iVar2 != 1) goto LAB_00136f26;
    iVar2 = Int32FromEnv("INT_VAL2",10);
    if (iVar2 != -1) goto LAB_00136f2b;
    iVar2 = Int32FromEnv("INT_VAL_UNKNOWN",10);
    if (iVar2 != 10) goto LAB_00136f30;
    setenv("INT_VAL3","4294967295",1);
    uVar3 = Uint32FromEnv("INT_VAL1",10);
    if (uVar3 != 1) goto LAB_00136f35;
    uVar3 = Uint32FromEnv("INT_VAL3",0x1e);
    if (uVar3 != 0xffffffff) goto LAB_00136f3a;
    uVar3 = Uint32FromEnv("INT_VAL_UNKNOWN",10);
    if (uVar3 != 10) goto LAB_00136f3f;
    setenv("INT_VAL4","1099511627776",1);
    iVar5 = Int64FromEnv("INT_VAL1",0x14);
    if (iVar5 != 1) goto LAB_00136f44;
    iVar5 = Int64FromEnv("INT_VAL2",0x14);
    if (iVar5 != -1) goto LAB_00136f49;
    iVar5 = Int64FromEnv("INT_VAL4",0x14);
    if (iVar5 != 0x10000000000) goto LAB_00136f4e;
    iVar5 = Int64FromEnv("INT_VAL_UNKNOWN",0x14);
    if (iVar5 != 0x14) goto LAB_00136f53;
    uVar6 = Uint64FromEnv("INT_VAL1",0x1e);
    if (uVar6 != 1) goto LAB_00136f58;
    uVar6 = Uint64FromEnv("INT_VAL4",0x1e);
    if (uVar6 != 0x10000000000) goto LAB_00136f5d;
    uVar6 = Uint64FromEnv("INT_VAL_UNKNOWN",0x1e);
    if (uVar6 != 0x1e) goto LAB_00136f62;
    setenv("DOUBLE_VAL1","0.0",1);
    setenv("DOUBLE_VAL2","1.0",1);
    setenv("DOUBLE_VAL3","-1.0",1);
    dVar8 = DoubleFromEnv("DOUBLE_VAL1",40.0);
    if ((dVar8 != 0.0) || (NAN(dVar8))) goto LAB_00136f67;
    dVar8 = DoubleFromEnv("DOUBLE_VAL2",40.0);
    if ((dVar8 != 1.0) || (NAN(dVar8))) goto LAB_00136f6c;
    dVar8 = DoubleFromEnv("DOUBLE_VAL3",40.0);
    if ((dVar8 != -1.0) || (NAN(dVar8))) goto LAB_00136f71;
    dVar8 = DoubleFromEnv("DOUBLE_VAL_UNKNOWN",40.0);
    if ((dVar8 != 40.0) || (NAN(dVar8))) goto LAB_00136f76;
    setenv("STRING_VAL1","",1);
    setenv("STRING_VAL2","my happy string!",1);
    pcVar7 = StringFromEnv("STRING_VAL1","unknown");
    if (*pcVar7 != '\0') goto LAB_00136f7b;
    pcVar7 = StringFromEnv("STRING_VAL2","unknown");
    iVar4 = strcmp("my happy string!",pcVar7);
    if (iVar4 == 0) {
      pcVar7 = StringFromEnv("STRING_VAL_UNKNOWN","unknown");
      iVar4 = strcmp("unknown",pcVar7);
      if (iVar4 == 0) {
        FlagSaver::~FlagSaver(&local_10);
        return;
      }
      goto LAB_00136f85;
    }
  }
  _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
LAB_00136f85:
  _GLOBAL__N_1::Test_FromEnvTest_LegalValues::Run();
  FlagSaver::~FlagSaver(&local_10);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST(FromEnvTest, LegalValues) {
  setenv("BOOL_VAL1", "true", 1);
  setenv("BOOL_VAL2", "false", 1);
  setenv("BOOL_VAL3", "1", 1);
  setenv("BOOL_VAL4", "F", 1);
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL1", false));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL2", true));
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL3", false));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL4", true));
  EXPECT_TRUE(BoolFromEnv("BOOL_VAL_UNKNOWN", true));
  EXPECT_FALSE(BoolFromEnv("BOOL_VAL_UNKNOWN", false));

  setenv("INT_VAL1", "1", 1);
  setenv("INT_VAL2", "-1", 1);
  EXPECT_EQ(1, Int32FromEnv("INT_VAL1", 10));
  EXPECT_EQ(-1, Int32FromEnv("INT_VAL2", 10));
  EXPECT_EQ(10, Int32FromEnv("INT_VAL_UNKNOWN", 10));

  setenv("INT_VAL3", "4294967295", 1);
  EXPECT_EQ(1, Uint32FromEnv("INT_VAL1", 10));
  EXPECT_EQ(4294967295L, Uint32FromEnv("INT_VAL3", 30));
  EXPECT_EQ(10, Uint32FromEnv("INT_VAL_UNKNOWN", 10));

  setenv("INT_VAL4", "1099511627776", 1);
  EXPECT_EQ(1, Int64FromEnv("INT_VAL1", 20));
  EXPECT_EQ(-1, Int64FromEnv("INT_VAL2", 20));
  EXPECT_EQ(1099511627776LL, Int64FromEnv("INT_VAL4", 20));
  EXPECT_EQ(20, Int64FromEnv("INT_VAL_UNKNOWN", 20));

  EXPECT_EQ(1, Uint64FromEnv("INT_VAL1", 30));
  EXPECT_EQ(1099511627776ULL, Uint64FromEnv("INT_VAL4", 30));
  EXPECT_EQ(30, Uint64FromEnv("INT_VAL_UNKNOWN", 30));

  // I pick values here that can be easily represented exactly in floating-point
  setenv("DOUBLE_VAL1", "0.0", 1);
  setenv("DOUBLE_VAL2", "1.0", 1);
  setenv("DOUBLE_VAL3", "-1.0", 1);
  EXPECT_EQ(0.0, DoubleFromEnv("DOUBLE_VAL1", 40.0));
  EXPECT_EQ(1.0, DoubleFromEnv("DOUBLE_VAL2", 40.0));
  EXPECT_EQ(-1.0, DoubleFromEnv("DOUBLE_VAL3", 40.0));
  EXPECT_EQ(40.0, DoubleFromEnv("DOUBLE_VAL_UNKNOWN", 40.0));

  setenv("STRING_VAL1", "", 1);
  setenv("STRING_VAL2", "my happy string!", 1);
  EXPECT_STREQ("", StringFromEnv("STRING_VAL1", "unknown"));
  EXPECT_STREQ("my happy string!", StringFromEnv("STRING_VAL2", "unknown"));
  EXPECT_STREQ("unknown", StringFromEnv("STRING_VAL_UNKNOWN", "unknown"));
}